

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O2

void __thiscall JsrtCallbackState::~JsrtCallbackState(JsrtCallbackState *this)

{
  JsrtContext *pJVar1;
  bool bVar2;
  JsrtContext *pJVar3;
  
  pJVar1 = this->originalJsrtContext;
  if (pJVar1 == (JsrtContext *)0x0) {
    bVar2 = ThreadContextTLSEntry::TrySetThreadContext(this->originalThreadContext);
  }
  else {
    pJVar3 = JsrtContext::GetCurrent();
    if (pJVar1 == pJVar3) {
      return;
    }
    bVar2 = JsrtContext::TrySetCurrent(this->originalJsrtContext);
  }
  if (bVar2 != false) {
    return;
  }
  Js::Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

JsrtCallbackState::~JsrtCallbackState()
{
    if (originalJsrtContext != nullptr)
    {
        if (originalJsrtContext != JsrtContext::GetCurrent())
        {
            // This shouldn't fail as the context was previously set on the current thread.
            bool isSet = JsrtContext::TrySetCurrent(originalJsrtContext);
            if (!isSet)
            {
                Js::Throw::FatalInternalError();
            }
        }
    }
    else
    {
        bool isSet = ThreadContextTLSEntry::TrySetThreadContext(originalThreadContext);
        if (!isSet)
        {
            Js::Throw::FatalInternalError();
        }
    }
}